

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

_outconnect * obj_connect(t_object *source,int outno,t_object *sink,int inno)

{
  _outconnect **pp_Var1;
  _outconnect *p_Var2;
  _outconnect **ochead;
  _outconnect *oc2;
  _outconnect *oc;
  t_pd *to;
  _outlet *o;
  _inlet *i;
  int inno_local;
  t_object *sink_local;
  int outno_local;
  t_object *source_local;
  
  sink_local._4_4_ = outno;
  for (to = (t_pd *)source->te_outlet; to != (t_pd *)0x0 && sink_local._4_4_ != 0;
      to = (t_pd *)to[1]) {
    sink_local._4_4_ = sink_local._4_4_ + -1;
  }
  if (to == (t_pd *)0x0) {
    return (_outconnect *)0x0;
  }
  i._4_4_ = inno;
  if (((sink->te_g).g_pd)->c_firstin != '\0') {
    oc = (_outconnect *)sink;
    if (inno == 0) goto LAB_001a2379;
    i._4_4_ = inno + -1;
  }
  for (o = (_outlet *)sink->te_inlet; o != (_outlet *)0x0 && i._4_4_ != 0; o = o->o_next) {
    i._4_4_ = i._4_4_ + -1;
  }
  if (o == (_outlet *)0x0) {
    return (_outconnect *)0x0;
  }
  oc = (_outconnect *)o;
LAB_001a2379:
  pp_Var1 = outlet_getconnectionpointer((_outlet *)to);
  p_Var2 = (_outconnect *)getbytes(0x10);
  p_Var2->oc_next = (_outconnect *)0x0;
  p_Var2->oc_to = (t_pd *)oc;
  ochead = &(*pp_Var1)->oc_next;
  if ((_outconnect *)ochead == (_outconnect *)0x0) {
    *pp_Var1 = p_Var2;
  }
  else {
    for (; *ochead != (_outconnect *)0x0; ochead = &(*ochead)->oc_next) {
    }
    *ochead = p_Var2;
  }
  if (to[3] == (t_pd)&s_signal) {
    canvas_update_dsp();
  }
  return p_Var2;
}

Assistant:

t_outconnect *obj_connect(t_object *source, int outno,
    t_object *sink, int inno)
{
    t_inlet *i;
    t_outlet *o;
    t_pd *to;
    t_outconnect *oc, *oc2, **ochead;

    for (o = source->ob_outlet; o && outno; o = o->o_next, outno--) ;
    if (!o) return (0);

    if (sink->ob_pd->c_firstin)
    {
        if (!inno)
        {
            to = &sink->ob_pd;
            goto doit;
        }
        else inno--;
    }
    for (i = sink->ob_inlet; i && inno; i = i->i_next, inno--) ;
    if (!i) return (0);
    to = &i->i_pd;
doit:
    ochead = outlet_getconnectionpointer(o);
    oc = (t_outconnect *)t_getbytes(sizeof(*oc));
    oc->oc_next = 0;
    oc->oc_to = to;
        /* append it to the end of the list */
        /* LATER we might cache the last "oc" to make this faster. */
    if ((oc2 = *ochead))
    {
        while (oc2->oc_next)
            oc2 = oc2->oc_next;
        oc2->oc_next = oc;
    }
    else *ochead = oc;
    if (o->o_sym == &s_signal) canvas_update_dsp();

    return (oc);
}